

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportMemory
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index memory_index,Limits *page_limits)

{
  Module *this_00;
  uint64_t uVar1;
  undefined1 local_78 [8];
  string_view module_name_local;
  undefined1 local_48 [8];
  string_view field_name_local;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_30;
  
  field_name_local.data_ = (char *)field_name.size_;
  local_48 = (undefined1  [8])field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  local_78 = (undefined1  [8])module_name.data_;
  MakeUnique<wabt::MemoryImport>();
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_78);
  std::__cxx11::string::operator=
            ((string *)(field_name_local.size_ + 8),(string *)&module_name_local.size_);
  std::__cxx11::string::~string((string *)&module_name_local.size_);
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_48);
  std::__cxx11::string::operator=
            ((string *)(field_name_local.size_ + 0x28),(string *)&module_name_local.size_);
  std::__cxx11::string::~string((string *)&module_name_local.size_);
  *(undefined2 *)(field_name_local.size_ + 0x80) = *(undefined2 *)&page_limits->has_max;
  uVar1 = page_limits->max;
  *(uint64_t *)(field_name_local.size_ + 0x70) = page_limits->initial;
  *(uint64_t *)(field_name_local.size_ + 0x78) = uVar1;
  this_00 = this->module_;
  GetLocation((Location *)&module_name_local.size_,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
            ((wabt *)&local_30,
             (unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
             &field_name_local.size_,(Location *)&module_name_local.size_);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_30);
  if (local_30._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
      0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       0x0;
  if (field_name_local.size_ != 0) {
    (**(code **)(*(long *)field_name_local.size_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportMemory(Index import_index,
                                      string_view module_name,
                                      string_view field_name,
                                      Index memory_index,
                                      const Limits* page_limits) {
  auto import = MakeUnique<MemoryImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->memory.page_limits = *page_limits;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}